

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main)

{
  int iVar1;
  int iVar2;
  WebPWorkerInterface *pWVar3;
  VP8LEncoder *pVVar4;
  long lVar5;
  VP8LBitWriter *in_RDX;
  long lVar6;
  long lVar7;
  WebPPicture *in_RSI;
  vp8l_atype_t in_RDI;
  int ok_side;
  StreamEncodeContext *param;
  WebPWorker *worker;
  int params_size;
  int ok_main;
  WebPWorkerInterface *worker_interface;
  WebPPicture picture_side;
  VP8LBitWriter bw_side;
  WebPAuxStats stats_side;
  StreamEncodeContext params_side;
  StreamEncodeContext params_main;
  WebPWorker worker_side;
  WebPWorker worker_main;
  int red_and_blue_always_zero;
  int idx;
  int num_crunch_configs_side;
  int num_crunch_configs_main;
  CrunchConfig crunch_configs [14];
  VP8LEncoder *enc_side;
  VP8LEncoder *enc_main;
  int in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  VP8LEncoder *in_stack_fffffffffffff830;
  WebPPicture *in_stack_fffffffffffff838;
  VP8LBitWriter *local_7c0;
  VP8LEncoder *in_stack_fffffffffffff848;
  VP8LBitWriter *in_stack_fffffffffffff858;
  VP8LEncoder *in_stack_fffffffffffff860;
  undefined1 local_788 [8];
  int *in_stack_fffffffffffff880;
  int *in_stack_fffffffffffff888;
  CrunchConfig *in_stack_fffffffffffff890;
  VP8LEncoder *in_stack_fffffffffffff898;
  WebPEncodingError local_700;
  VP8LBitWriter local_688;
  undefined1 local_654 [220];
  undefined8 auStack_578 [3];
  undefined8 auStack_560 [46];
  uint32_t local_3f0;
  VP8LBitWriter local_3e0;
  undefined8 uStack_3b0;
  undefined4 auStack_3a8 [92];
  uint32_t local_238;
  undefined1 local_228 [48];
  undefined1 local_1f8 [456];
  VP8LEncoder *local_30;
  VP8LEncoder *local_28;
  VP8LBitWriter *local_20;
  WebPPicture *local_18;
  vp8l_atype_t local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = VP8LEncoderNew((WebPConfig *)in_stack_fffffffffffff838,
                            (WebPPicture *)in_stack_fffffffffffff830);
  local_30 = (VP8LEncoder *)0x0;
  local_1f8._56_4_ = 0;
  local_1f8._48_4_ = 0;
  pWVar3 = WebPGetWorkerInterface();
  if ((local_28 == (VP8LEncoder *)0x0) ||
     (iVar1 = VP8LBitWriterInit((VP8LBitWriter *)in_stack_fffffffffffff830,
                                CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828)),
     iVar1 == 0)) {
    VP8LEncoderDelete(in_stack_fffffffffffff830);
    iVar1 = WebPEncodingSetError(local_18,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar1;
  }
  iVar1 = WebPPictureInit((WebPPicture *)0x18233e);
  if (iVar1 != 0) {
    iVar1 = EncoderAnalyze(in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                           in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    if ((iVar1 == 0) || (iVar1 = EncoderInit(in_stack_fffffffffffff848), iVar1 == 0)) {
      WebPEncodingSetError(local_18,VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    else {
      if (0 < *(int *)(local_10 + 0x54)) {
        local_1f8._56_4_ = (int)local_1f8._60_4_ / 2;
        for (local_1f8._52_4_ = 0; (int)local_1f8._52_4_ < (int)local_1f8._56_4_;
            local_1f8._52_4_ = local_1f8._52_4_ + 1) {
          lVar5 = (long)(int)local_1f8._52_4_;
          lVar6 = (long)(int)((local_1f8._60_4_ - local_1f8._56_4_) + local_1f8._52_4_);
          lVar7 = lVar6 * 0x1c;
          *(undefined8 *)((long)auStack_578 + lVar5 * 0x1c) =
               *(undefined8 *)(local_1f8 + lVar7 + 0x40);
          *(undefined8 *)((long)auStack_578 + lVar5 * 0x1c + 8) =
               *(undefined8 *)(local_1f8 + lVar7 + 0x48);
          *(undefined8 *)((long)auStack_560 + (lVar5 * 7 + -2) * 4) =
               *(undefined8 *)(local_1f8 + lVar7 + 0x50);
          *(undefined4 *)((long)auStack_560 + lVar5 * 0x1c) =
               *(undefined4 *)(local_1f8 + lVar6 * 0x1c + 0x58);
        }
        local_3f0 = local_1f8._56_4_;
      }
      local_1f8._60_4_ = local_1f8._60_4_ - local_1f8._56_4_;
      for (local_1f8._52_4_ = 0; (int)local_1f8._52_4_ < (int)local_1f8._60_4_;
          local_1f8._52_4_ = local_1f8._52_4_ + 1) {
        lVar5 = (long)(int)local_1f8._52_4_;
        lVar6 = (long)(int)local_1f8._52_4_;
        lVar7 = lVar6 * 0x1c;
        *(undefined8 *)((long)&local_3e0.end + lVar5 * 0x1c) =
             *(undefined8 *)(local_1f8 + lVar7 + 0x40);
        *(undefined8 *)(&local_3e0.error + lVar5 * 7) = *(undefined8 *)(local_1f8 + lVar7 + 0x48);
        *(undefined8 *)((long)&uStack_3b0 + lVar5 * 0x1c) =
             *(undefined8 *)(local_1f8 + lVar7 + 0x50);
        auStack_3a8[lVar5 * 7] = *(undefined4 *)(local_1f8 + lVar6 * 0x1c + 0x58);
      }
      local_238 = local_1f8._60_4_;
      iVar1 = 1;
      if (0 < (int)local_1f8._56_4_) {
        iVar1 = 2;
      }
      for (local_1f8._52_4_ = 0; (int)local_1f8._52_4_ < iVar1;
          local_1f8._52_4_ = local_1f8._52_4_ + 1) {
        if (local_1f8._52_4_ == 0) {
          pVVar4 = (VP8LEncoder *)(local_228 + 0x30);
          local_7c0 = &local_3e0;
        }
        else {
          pVVar4 = (VP8LEncoder *)local_228;
          local_7c0 = (VP8LBitWriter *)(local_654 + 0xbc);
        }
        local_7c0->bits = local_10;
        *(undefined4 *)&local_7c0[8].field_0x2c = local_1f8._48_4_;
        in_stack_fffffffffffff860 = pVVar4;
        if (local_1f8._52_4_ == 0) {
          *(WebPPicture **)&local_7c0->used = local_18;
          local_7c0[9].bits = (vp8l_atype_t)local_18->stats;
          local_7c0->buf = (uint8_t *)local_20;
          local_7c0->cur = (uint8_t *)local_28;
        }
        else {
          WebPPictureView(in_stack_fffffffffffff838,(int)((ulong)in_stack_fffffffffffff830 >> 0x20),
                          (int)in_stack_fffffffffffff830,in_stack_fffffffffffff82c,
                          in_stack_fffffffffffff828,(WebPPicture *)0x182648);
          *(undefined1 **)&local_7c0->used = local_788;
          if (local_18->stats == (WebPAuxStats *)0x0) {
            in_stack_fffffffffffff838 = (WebPPicture *)0x0;
          }
          else {
            in_stack_fffffffffffff838 = (WebPPicture *)local_654;
          }
          local_7c0[9].bits = (vp8l_atype_t)in_stack_fffffffffffff838;
          iVar2 = VP8LBitWriterClone((VP8LBitWriter *)in_stack_fffffffffffff838,
                                     (VP8LBitWriter *)in_stack_fffffffffffff830);
          if (iVar2 == 0) {
            WebPEncodingSetError(local_18,VP8_ENC_ERROR_OUT_OF_MEMORY);
            goto LAB_001829c5;
          }
          local_7c0->buf = (uint8_t *)&local_688;
          local_30 = VP8LEncoderNew((WebPConfig *)in_stack_fffffffffffff838,
                                    (WebPPicture *)in_stack_fffffffffffff830);
          if ((local_30 == (VP8LEncoder *)0x0) || (iVar2 = EncoderInit(pVVar4), iVar2 == 0)) {
            WebPEncodingSetError(local_18,VP8_ENC_ERROR_OUT_OF_MEMORY);
            goto LAB_001829c5;
          }
          local_30->histo_bits = local_28->histo_bits;
          local_30->predictor_transform_bits = local_28->predictor_transform_bits;
          local_30->cross_color_transform_bits = local_28->cross_color_transform_bits;
          local_30->palette_size = local_28->palette_size;
          memcpy(local_30->palette,local_28->palette,0x400);
          memcpy(local_30->palette_sorted,local_28->palette_sorted,0x400);
          local_7c0->cur = (uint8_t *)local_30;
        }
        (*pWVar3->Init)((WebPWorker *)in_stack_fffffffffffff860);
        *(VP8LBitWriter **)&in_stack_fffffffffffff860->argb_content = local_7c0;
        in_stack_fffffffffffff860->argb_scratch = (uint32_t *)0x0;
        in_stack_fffffffffffff860->argb = (uint32_t *)EncodeStreamHook;
        in_stack_fffffffffffff858 = local_7c0;
      }
      if (local_1f8._56_4_ != 0) {
        iVar1 = (*pWVar3->Reset)((WebPWorker *)local_228);
        if (iVar1 == 0) {
          WebPEncodingSetError(local_18,VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto LAB_001829c5;
        }
        if (local_18->stats != (WebPAuxStats *)0x0) {
          memcpy(local_654,local_18->stats,0xbc);
        }
        (*pWVar3->Launch)((WebPWorker *)local_228);
      }
      (*pWVar3->Execute)((WebPWorker *)(local_228 + 0x30));
      iVar1 = (*pWVar3->Sync)((WebPWorker *)(local_228 + 0x30));
      (*pWVar3->End)((WebPWorker *)(local_228 + 0x30));
      if (local_1f8._56_4_ != 0) {
        iVar2 = (*pWVar3->Sync)((WebPWorker *)local_228);
        (*pWVar3->End)((WebPWorker *)local_228);
        if ((iVar1 == 0) || (iVar2 == 0)) {
          if (local_18->error_code == VP8_ENC_OK) {
            WebPEncodingSetError(local_18,local_700);
          }
        }
        else {
          in_stack_fffffffffffff830 = (VP8LEncoder *)VP8LBitWriterNumBytes(&local_688);
          pVVar4 = (VP8LEncoder *)VP8LBitWriterNumBytes(local_20);
          if ((in_stack_fffffffffffff830 < pVVar4) &&
             (VP8LBitWriterSwap((VP8LBitWriter *)in_stack_fffffffffffff860,in_stack_fffffffffffff858
                               ), local_18->stats != (WebPAuxStats *)0x0)) {
            memcpy(local_18->stats,local_654,0xbc);
          }
        }
      }
    }
  }
LAB_001829c5:
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x1829d2);
  VP8LEncoderDelete(in_stack_fffffffffffff830);
  VP8LEncoderDelete(in_stack_fffffffffffff830);
  return (uint)(local_18->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeStream(const WebPConfig* const config,
                     const WebPPicture* const picture,
                     VP8LBitWriter* const bw_main) {
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  WebPPicture picture_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  if (enc_main == NULL || !VP8LBitWriterInit(&bw_side, 0)) {
    VP8LEncoderDelete(enc_main);
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // Avoid "garbage value" error from Clang's static analysis tool.
  if (!WebPPictureInit(&picture_side)) {
    goto Error;
  }

  // Analyze image (entropy, num_palettes etc)
  if (!EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config = config;
      param->red_and_blue_always_zero = red_and_blue_always_zero;
      if (idx == 0) {
        param->picture = picture;
        param->stats = picture->stats;
        param->bw = bw_main;
        param->enc = enc_main;
      } else {
        // Create a side picture (error_code is not thread-safe).
        if (!WebPPictureView(picture, /*left=*/0, /*top=*/0, picture->width,
                             picture->height, &picture_side)) {
          assert(0);
        }
        picture_side.progress_hook = NULL;  // Progress hook is not thread-safe.
        param->picture = &picture_side;  // No need to free a view afterwards.
        param->stats = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        param->bw = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, &picture_side);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits = enc_main->histo_bits;
        enc_side->predictor_transform_bits =
            enc_main->predictor_transform_bits;
        enc_side->cross_color_transform_bits =
            enc_main->cross_color_transform_bits;
        enc_side->palette_size = enc_main->palette_size;
        memcpy(enc_side->palette, enc_main->palette,
               sizeof(enc_main->palette));
        memcpy(enc_side->palette_sorted, enc_main->palette_sorted,
               sizeof(enc_main->palette_sorted));
        param->enc = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      if (picture->error_code == VP8_ENC_OK) {
        assert(picture_side.error_code != VP8_ENC_OK);
        WebPEncodingSetError(picture, picture_side.error_code);
      }
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  }

 Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return (picture->error_code == VP8_ENC_OK);
}